

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong wpos_00;
  ulong in_RCX;
  uivector *in_RDX;
  Hash *in_RSI;
  ulong in_R8;
  uint in_R9D;
  bool bVar6;
  uint in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  uint skip;
  uint chainlength;
  size_t wpos;
  uint hashpos;
  uchar *backptr;
  uchar *foreptr;
  uchar *lastptr;
  uint prev_offset;
  uint current_length;
  uint current_offset;
  uint hashval;
  uint lazyoffset;
  uint lazylength;
  uint lazy;
  uint length;
  uint offset;
  uint numzeros;
  uint usezeros;
  uint maxlazymatch;
  uint maxchainlength;
  uint error;
  uint i;
  size_t pos;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  ulong in_stack_ffffffffffffff30;
  ulong length_00;
  uivector *values;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_9c;
  uchar *local_98;
  uchar *local_90;
  uint local_7c;
  uint local_6c;
  uint local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_44;
  ulong local_40;
  
  local_b4 = in_R9D;
  if (in_R9D < 0x2000) {
    local_b4 = in_R9D >> 3;
  }
  uVar2 = 0x40;
  if (0x1fff < in_R9D) {
    uVar2 = 0x102;
  }
  local_58 = 0;
  bVar1 = false;
  local_68 = 0;
  local_6c = 0;
  if ((in_R9D == 0) || (0x8000 < in_R9D)) {
    return 0x3c;
  }
  if ((in_R9D & in_R9D - 1) != 0) {
    return 0x5a;
  }
  local_40 = in_RCX;
  if (0x102 < in_stack_00000010) {
    in_stack_00000010 = 0x102;
  }
  do {
    if (in_R8 <= local_40) {
      return 0;
    }
    wpos_00 = local_40 & in_R9D - 1;
    local_ac = 0;
    uVar3 = getHash((uchar *)in_RDX,in_R8,local_40);
    if (uVar3 == 0) {
      if (local_58 == 0) {
        local_58 = countZeros((uchar *)in_RDX,in_R8,local_40);
      }
      else if ((in_R8 < local_40 + local_58) ||
              (*(uchar *)((long)in_RDX + local_40 + local_58 + -1) != '\0')) {
        local_58 = local_58 - 1;
      }
    }
    else {
      local_58 = 0;
    }
    updateHashChain(in_RSI,wpos_00,uVar3,(unsigned_short)local_58);
    local_60 = 0;
    local_5c = 0;
    local_9c = (uint)in_RSI->chain[wpos_00];
    length_00 = in_R8;
    if (local_40 + 0x102 <= in_R8) {
      length_00 = local_40 + 0x102;
    }
    local_7c = 0;
    do {
      while( true ) {
        if (local_b4 <= local_ac) goto LAB_002bc467;
        if (wpos_00 < local_9c) {
          in_stack_ffffffffffffff30 = (wpos_00 - local_9c) + (ulong)in_R9D;
        }
        else {
          in_stack_ffffffffffffff30 = wpos_00 - local_9c;
        }
        uVar4 = (uint)in_stack_ffffffffffffff30;
        if (uVar4 < local_7c) goto LAB_002bc467;
        if (uVar4 != 0) {
          local_90 = (uchar *)((long)&in_RDX->data + local_40);
          local_98 = (uchar *)((long)in_RDX + (local_40 - (in_stack_ffffffffffffff30 & 0xffffffff)))
          ;
          if (2 < local_58) {
            local_b0 = (uint)in_RSI->zeros[local_9c];
            if (local_58 < local_b0) {
              local_b0 = local_58;
            }
            local_98 = local_98 + local_b0;
            local_90 = local_90 + local_b0;
          }
          while( true ) {
            bVar6 = false;
            if (local_90 != (uchar *)((long)&in_RDX->data + length_00)) {
              bVar6 = *local_98 == *local_90;
            }
            if (!bVar6) break;
            local_98 = local_98 + 1;
            local_90 = local_90 + 1;
          }
          uVar5 = (int)local_90 - ((int)in_RDX + (int)local_40);
          in_stack_ffffffffffffff2f = 0;
          if ((local_60 < uVar5) && (local_60 = uVar5, local_5c = uVar4, in_stack_00000010 <= uVar5)
             ) goto LAB_002bc467;
        }
        if (local_9c == in_RSI->chain[local_9c]) goto LAB_002bc467;
        local_7c = uVar4;
        if ((local_58 < 3) || (local_60 <= local_58)) break;
        local_9c = (uint)in_RSI->chainz[local_9c];
        local_ac = local_ac + 1;
        if (in_RSI->zeros[local_9c] != local_58) goto LAB_002bc467;
      }
      local_9c = (uint)in_RSI->chain[local_9c];
      local_ac = local_ac + 1;
    } while (in_RSI->val[local_9c] == uVar3);
LAB_002bc467:
    values = in_RDX;
    if (in_stack_00000018 == 0) {
LAB_002bc58a:
      if ((2 < local_60) && (in_R9D < local_5c)) {
        return 0x56;
      }
      if (local_60 < 3) {
        uVar3 = uivector_push_back((uivector *)
                                   CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),0);
        if (uVar3 == 0) {
          return 0x53;
        }
      }
      else if ((local_60 < in_stack_00000008) || ((local_60 == 3 && (0x1000 < local_5c)))) {
        uVar3 = uivector_push_back((uivector *)
                                   CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),0);
        if (uVar3 == 0) {
          return 0x53;
        }
      }
      else {
        addLengthDistance(values,length_00,in_stack_ffffffffffffff30);
        for (local_44 = 1; local_44 < local_60; local_44 = local_44 + 1) {
          local_40 = local_40 + 1;
          uVar3 = getHash((uchar *)in_RDX,in_R8,local_40);
          if (uVar3 == 0) {
            if (local_58 == 0) {
              local_58 = countZeros((uchar *)in_RDX,in_R8,local_40);
            }
            else if ((in_R8 < local_40 + local_58) ||
                    (*(uchar *)((long)&in_RDX->data + local_40 + local_58 + -1) != '\0')) {
              local_58 = local_58 - 1;
            }
          }
          else {
            local_58 = 0;
          }
          updateHashChain(in_RSI,local_40 & in_R9D - 1,uVar3,(unsigned_short)local_58);
        }
      }
    }
    else {
      if ((((bVar1) || (local_60 < 3)) || (uVar2 < local_60)) || (0x101 < local_60)) {
        if (bVar1) {
          bVar1 = false;
          if (local_40 == 0) {
            return 0x51;
          }
          if (local_68 + 1 < local_60) {
            uVar3 = uivector_push_back((uivector *)
                                       CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)
                                       ,0);
            if (uVar3 == 0) {
              return 0x53;
            }
          }
          else {
            local_60 = local_68;
            local_5c = local_6c;
            in_RSI->head[uVar3] = -1;
            in_RSI->headz[local_58] = -1;
            local_40 = local_40 - 1;
          }
        }
        goto LAB_002bc58a;
      }
      bVar1 = true;
      local_68 = local_60;
      local_6c = local_5c;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching)
{
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos)
  {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0)
    {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    }
    else
    {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;)
    {
      if(chainlength++ >= maxchainlength) break;
      current_offset = hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize;

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0)
      {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3)
        {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/
        {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length)
        {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros)
      {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      }
      else
      {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching)
    {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH)
      {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy)
      {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1)
        {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        }
        else
        {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/
    {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else if(length < minmatch || (length == 3 && offset > 4096))
    {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else
    {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i)
      {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0)
        {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        }
        else
        {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}